

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRanges.hpp
# Opt level: O3

vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
* __thiscall
njoy::ENDFtk::section::Type<2,151>::Isotope::
readRanges<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
           *__return_storage_ptr__,Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LFW,int NER)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *begin_00;
  undefined8 *puVar1;
  int local_1a0;
  int NAPS;
  Isotope *local_198;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_190;
  long local_188;
  long local_180;
  double EH;
  double EL;
  ControlRecord cont;
  optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> radius;
  ResonanceParameters parameters;
  
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190 = begin;
  if (LFW < 0) {
    tools::Log::error<char_const*>("Encountered illegal NER value");
    tools::Log::info<char_const*>("NER required to be zero or greater");
    tools::Log::info<char_const*,int>("NER value: {}",LFW);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  std::
  vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  ::reserve(__return_storage_ptr__,(ulong)(uint)LFW);
  local_1a0 = LFW;
  local_198 = this;
  if (LFW != 0) {
    do {
      begin_00 = local_190;
      ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&cont,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,local_190,(long *)end,(int)lineNumber,MAT,MF);
      EL = cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      EH = cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      local_180 = cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl;
      local_188 = cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                  _M_head_impl;
      NAPS = (int)cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                  super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
      readScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&radius,this,begin_00,end,(long *)((ulong)lineNumber & 0xffffffff),MAT,MF,
                 (int)cont.
                      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                      super__Head_base<4UL,_long,_false>._M_head_impl,(int)__return_storage_ptr__);
      readParameters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&parameters,this,begin_00,end,(long *)((ulong)lineNumber & 0xffffffff),MAT,MF,
                 (int)local_180,(int)local_188,MT,(int)__return_storage_ptr__);
      std::
      vector<njoy::ENDFtk::section::Type<2,151>::ResonanceRange,std::allocator<njoy::ENDFtk::section::Type<2,151>::ResonanceRange>>
      ::
      emplace_back<double&,double&,int&,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>,std::optional<njoy::ENDFtk::section::Type<2,151>::ScatteringRadius>>
                ((vector<njoy::ENDFtk::section::Type<2,151>::ResonanceRange,std::allocator<njoy::ENDFtk::section::Type<2,151>::ResonanceRange>>
                  *)__return_storage_ptr__,&EL,&EH,&NAPS,
                 (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                  *)&parameters,&radius);
      std::__detail::__variant::
      _Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
      ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                           *)&parameters);
      this = local_198;
      if (radius.
          super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>.
          _M_payload.
          super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
          .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>.
          _M_engaged == true) {
        std::_Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>::
        _M_destroy((_Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *)
                   &radius);
      }
      local_1a0 = local_1a0 + -1;
    } while (local_1a0 != 0);
  }
  return (vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
          *)(vector<njoy::ENDFtk::section::Type<2,151>::ResonanceRange,std::allocator<njoy::ENDFtk::section::Type<2,151>::ResonanceRange>>
             *)__return_storage_ptr__;
}

Assistant:

static std::vector< ResonanceRange >
readRanges( Iterator& begin, const Iterator& end, long& lineNumber,
            int MAT, int MF, int MT,
            int LFW, int NER ) {

  std::vector< ResonanceRange > ranges;

  if ( NER < 0 ) {

    Log::error( "Encountered illegal NER value" );
    Log::info( "NER required to be zero or greater" );
    Log::info( "NER value: {}", NER );
    throw std::exception();
  }

  ranges.reserve( NER );

  while( NER-- ) {

    ControlRecord cont( begin, end, lineNumber, MAT, MF, MT );
    double EL = cont.C1();
    double EH = cont.C2();
    int LRU = cont.L1();
    int LRF = cont.L2();
    int NRO = cont.N1();
    int NAPS = cont.N2();

    std::optional< ScatteringRadius > radius =
        readScatteringRadius( begin, end, lineNumber, MAT, MF, MT, NRO );

    ResonanceRange::ResonanceParameters parameters =
        readParameters( begin, end, lineNumber, MAT, MF, MT, LRU, LRF, LFW );

    ranges.emplace_back( EL, EH, NAPS,
                         std::move( parameters ), std::move( radius ) );
  }
  return ranges;
}